

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderCheckMark(ImVec2 pos,ImU32 col,float sz)

{
  ImVec2 in_XMM0_Qa;
  float in_XMM1_Da;
  float by;
  float bx;
  float third;
  float thickness;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImDrawList *pos_00;
  ImDrawList *in_stack_ffffffffffffffa0;
  ImDrawList *this;
  ImDrawList *pIVar1;
  ImVec2 in_stack_ffffffffffffffb0;
  ImVec2 local_48;
  ImVec2 local_40;
  float local_38;
  float local_34;
  float local_30;
  ImVec2 local_2c;
  float local_24;
  ImGuiWindow *local_20;
  ImGuiContext *local_18;
  float local_10;
  ImVec2 local_8;
  
  local_18 = GImGui;
  local_20 = GImGui->CurrentWindow;
  local_10 = in_XMM1_Da;
  local_8 = in_XMM0_Qa;
  local_24 = ImMax<float>(in_XMM1_Da / 5.0,1.0);
  local_10 = -local_24 * 0.5 + local_10;
  ImVec2::ImVec2(&local_2c,local_24 * 0.25,local_24 * 0.25);
  operator+=(&local_8,&local_2c);
  local_30 = local_10 / 3.0;
  local_34 = local_8.x + local_30;
  local_38 = -local_30 * 0.5 + local_8.y + local_10;
  pos_00 = local_20->DrawList;
  ImVec2::ImVec2(&local_40,local_34 - local_30,local_38 - local_30);
  ImDrawList::PathLineTo(in_stack_ffffffffffffffa0,(ImVec2 *)pos_00);
  this = local_20->DrawList;
  ImVec2::ImVec2(&local_48,local_34,local_38);
  ImDrawList::PathLineTo(this,(ImVec2 *)pos_00);
  pIVar1 = local_20->DrawList;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb0,local_30 + local_30 + local_34,
                 -local_30 + -local_30 + local_38);
  ImDrawList::PathLineTo(this,(ImVec2 *)pos_00);
  ImDrawList::PathStroke
            ((ImDrawList *)in_stack_ffffffffffffffb0,(ImU32)((ulong)pIVar1 >> 0x20),
             SUB81((ulong)pIVar1 >> 0x18,0),(float)((ulong)this >> 0x20));
  return;
}

Assistant:

void ImGui::RenderCheckMark(ImVec2 pos, ImU32 col, float sz)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    float thickness = ImMax(sz / 5.0f, 1.0f);
    sz -= thickness*0.5f;
    pos += ImVec2(thickness*0.25f, thickness*0.25f);

    float third = sz / 3.0f;
    float bx = pos.x + third;
    float by = pos.y + sz - third*0.5f;
    window->DrawList->PathLineTo(ImVec2(bx - third, by - third));
    window->DrawList->PathLineTo(ImVec2(bx, by));
    window->DrawList->PathLineTo(ImVec2(bx + third*2, by - third*2));
    window->DrawList->PathStroke(col, false, thickness);
}